

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes)

{
  ulong min_new_capacity;
  mz_bool mVar1;
  bool bVar2;
  mz_uint8 local_268 [8];
  mz_uint8 central_dir_header [46];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pmStack_220;
  mz_uint32 central_dir_ofs;
  mz_zip_internal_state *pState;
  void *pComment_local;
  void *pvStack_208;
  mz_uint16 extra_size_local;
  void *pExtra_local;
  char *pcStack_1f8;
  mz_uint16 filename_size_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  size_t local_1e0;
  size_t orig_size_4;
  void *local_1d0;
  mz_zip_array *local_1c8;
  char *local_1c0;
  uint local_1b4;
  size_t local_1b0;
  size_t orig_size_3;
  mz_zip_internal_state *local_1a0;
  mz_zip_internal_state *local_198;
  char *local_190;
  uint local_184;
  size_t local_180;
  size_t orig_size_2;
  void *local_170;
  mz_zip_internal_state *local_168;
  char *local_160;
  uint local_154;
  size_t local_150;
  size_t orig_size_1;
  char *local_140;
  mz_zip_internal_state *local_138;
  char *local_130;
  uint local_124;
  size_t local_120;
  size_t orig_size;
  mz_uint8 *local_110;
  mz_zip_internal_state *local_108;
  char *local_100;
  uint local_f8;
  undefined4 local_f4;
  ulong local_f0;
  mz_zip_internal_state *local_e8;
  char *local_e0;
  int local_d8;
  undefined4 local_d4;
  ulong local_d0;
  mz_zip_internal_state *local_c8;
  char *local_c0;
  int local_b8;
  undefined4 local_b4;
  ulong local_b0;
  mz_zip_internal_state *local_a8;
  char *local_a0;
  int local_98;
  undefined4 local_94;
  ulong local_90;
  mz_zip_internal_state *local_88;
  char *local_80;
  int local_78;
  undefined4 local_74;
  ulong local_70;
  mz_zip_array *local_68;
  char *local_60;
  int local_58;
  undefined4 local_54;
  ulong local_50;
  mz_zip_internal_state *local_48;
  char *local_40;
  
  pmStack_220 = pZip->m_pState;
  orig_central_dir_size._4_4_ = (undefined4)(pmStack_220->m_central_dir).m_size;
  min_new_capacity = (pmStack_220->m_central_dir).m_size;
  if (((param_15 < 0x100000000) &&
      ((pmStack_220->m_central_dir).m_size + 0x2e + (ulong)filename_size + (ulong)extra_size +
       (ulong)comment_size < 0x100000000)) &&
     (pState = (mz_zip_internal_state *)pComment, pComment_local._6_2_ = extra_size,
     pvStack_208 = pExtra, pExtra_local._6_2_ = filename_size, pcStack_1f8 = pFilename,
     pFilename_local = (char *)pZip,
     mVar1 = mz_zip_writer_create_central_dir_header
                       (pZip,local_268,filename_size,extra_size,comment_size,uncomp_size,comp_size,
                        uncomp_crc32,method,bit_flags,dos_time,dos_date,param_15,ext_attributes),
     mVar1 != 0)) {
    local_110 = local_268;
    local_100 = pFilename_local;
    local_108 = pmStack_220;
    orig_size = 0x2e;
    local_120 = (pmStack_220->m_central_dir).m_size;
    local_f0 = local_120 + 0x2e;
    local_e0 = pFilename_local;
    local_e8 = pmStack_220;
    local_f4 = 1;
    if (((pmStack_220->m_central_dir).m_capacity < local_f0) &&
       (mVar1 = mz_zip_array_ensure_capacity
                          ((mz_zip_archive *)pFilename_local,&pmStack_220->m_central_dir,local_f0,1)
       , mVar1 == 0)) {
      local_d8 = 0;
    }
    else {
      (local_e8->m_central_dir).m_size = local_f0;
      local_d8 = 1;
    }
    bVar2 = local_d8 != 0;
    if (bVar2) {
      memcpy((void *)((long)(local_108->m_central_dir).m_p +
                     local_120 * (local_108->m_central_dir).m_element_size),local_110,
             orig_size * (local_108->m_central_dir).m_element_size);
    }
    local_f8 = (uint)bVar2;
    if (local_f8 != 0) {
      orig_size_1 = (size_t)pExtra_local._6_2_;
      local_130 = pFilename_local;
      local_138 = pmStack_220;
      local_140 = pcStack_1f8;
      local_150 = (pmStack_220->m_central_dir).m_size;
      local_d0 = local_150 + orig_size_1;
      local_c0 = pFilename_local;
      local_c8 = pmStack_220;
      local_d4 = 1;
      if (((pmStack_220->m_central_dir).m_capacity < local_d0) &&
         (mVar1 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)pFilename_local,&pmStack_220->m_central_dir,local_d0,
                             1), mVar1 == 0)) {
        local_b8 = 0;
      }
      else {
        (local_c8->m_central_dir).m_size = local_d0;
        local_b8 = 1;
      }
      bVar2 = local_b8 != 0;
      if (bVar2) {
        memcpy((void *)((long)(local_138->m_central_dir).m_p +
                       local_150 * (local_138->m_central_dir).m_element_size),local_140,
               orig_size_1 * (local_138->m_central_dir).m_element_size);
      }
      local_124 = (uint)bVar2;
      if (local_124 != 0) {
        orig_size_2 = (size_t)pComment_local._6_2_;
        local_160 = pFilename_local;
        local_168 = pmStack_220;
        local_170 = pvStack_208;
        local_180 = (pmStack_220->m_central_dir).m_size;
        local_b0 = local_180 + orig_size_2;
        local_a0 = pFilename_local;
        local_a8 = pmStack_220;
        local_b4 = 1;
        if (((pmStack_220->m_central_dir).m_capacity < local_b0) &&
           (mVar1 = mz_zip_array_ensure_capacity
                              ((mz_zip_archive *)pFilename_local,&pmStack_220->m_central_dir,
                               local_b0,1), mVar1 == 0)) {
          local_98 = 0;
        }
        else {
          (local_a8->m_central_dir).m_size = local_b0;
          local_98 = 1;
        }
        bVar2 = local_98 != 0;
        if (bVar2) {
          memcpy((void *)((long)(local_168->m_central_dir).m_p +
                         local_180 * (local_168->m_central_dir).m_element_size),local_170,
                 orig_size_2 * (local_168->m_central_dir).m_element_size);
        }
        local_154 = (uint)bVar2;
        if (local_154 != 0) {
          orig_size_3 = (size_t)comment_size;
          local_190 = pFilename_local;
          local_198 = pmStack_220;
          local_1a0 = pState;
          local_1b0 = (pmStack_220->m_central_dir).m_size;
          local_90 = local_1b0 + orig_size_3;
          local_80 = pFilename_local;
          local_88 = pmStack_220;
          local_94 = 1;
          if (((pmStack_220->m_central_dir).m_capacity < local_90) &&
             (mVar1 = mz_zip_array_ensure_capacity
                                ((mz_zip_archive *)pFilename_local,&pmStack_220->m_central_dir,
                                 local_90,1), mVar1 == 0)) {
            local_78 = 0;
          }
          else {
            (local_88->m_central_dir).m_size = local_90;
            local_78 = 1;
          }
          bVar2 = local_78 != 0;
          if (bVar2) {
            memcpy((void *)((long)(local_198->m_central_dir).m_p +
                           local_1b0 * (local_198->m_central_dir).m_element_size),local_1a0,
                   orig_size_3 * (local_198->m_central_dir).m_element_size);
          }
          local_184 = (uint)bVar2;
          if (local_184 != 0) {
            local_1c8 = &pmStack_220->m_central_dir_offsets;
            local_1c0 = pFilename_local;
            local_1d0 = (void *)((long)&orig_central_dir_size + 4);
            orig_size_4 = 1;
            local_1e0 = (pmStack_220->m_central_dir_offsets).m_size;
            local_70 = local_1e0 + 1;
            local_60 = pFilename_local;
            local_74 = 1;
            local_68 = local_1c8;
            if (((pmStack_220->m_central_dir_offsets).m_capacity < local_70) &&
               (mVar1 = mz_zip_array_ensure_capacity
                                  ((mz_zip_archive *)pFilename_local,local_1c8,local_70,1),
               mVar1 == 0)) {
              local_58 = 0;
            }
            else {
              local_68->m_size = local_70;
              local_58 = 1;
            }
            bVar2 = local_58 != 0;
            if (bVar2) {
              memcpy((void *)((long)local_1c8->m_p + local_1e0 * local_1c8->m_element_size),
                     local_1d0,orig_size_4 * local_1c8->m_element_size);
            }
            local_1b4 = (uint)bVar2;
            if (local_1b4 != 0) {
              return 1;
            }
          }
        }
      }
    }
    local_40 = pFilename_local;
    local_48 = pmStack_220;
    local_54 = 0;
    local_50 = min_new_capacity;
    if ((min_new_capacity <= (pmStack_220->m_central_dir).m_capacity) ||
       (mVar1 = mz_zip_array_ensure_capacity
                          ((mz_zip_archive *)pFilename_local,&pmStack_220->m_central_dir,
                           min_new_capacity,0), mVar1 != 0)) {
      (local_48->m_central_dir).m_size = local_50;
    }
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  // No zip64 support yet
  if ((local_header_ofs > 0xFFFFFFFF) ||
      (((mz_uint64)pState->m_central_dir.m_size +
        MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
        comment_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size, extra_size, comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return MZ_FALSE;

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    // Try to push the central directory array back into its original state.
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  return MZ_TRUE;
}